

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar3;
  size_t sVar4;
  tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_> tVar5;
  Location loc;
  __uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(pcVar1);
  tVar5.super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       operator_new(0x170);
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x18) = sVar4;
  *(char **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                   .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar1;
  *(Offset *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
   super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       &PTR__FuncModuleField_001dd788;
  Func::Func((Func *)((long)tVar5.
                            super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                            .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl +
                     0x40),(string_view)ZEXT816(0));
  pcVar1 = this->filename_;
  aVar3.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str = pcVar1;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar3.offset;
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,(FuncDeclaration *)
                          ((long)tVar5.
                                 super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                                 .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl
                          + 0x60),&local_78);
  Var::~Var(&local_78);
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       (tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       tVar5.
       super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
       super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
      super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl != (FuncModuleField *)0x0)
  {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = std::make_unique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  SetFuncDeclaration(&func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}